

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

Iterator * __thiscall leveldb::Block::NewIterator(Block *this,Comparator *comparator)

{
  uint32_t num_restarts;
  char *data;
  Iter *this_00;
  Iterator *pIVar1;
  Status local_50;
  Slice local_48;
  Slice local_38;
  
  if (this->size_ < 4) {
    local_38.data_ = "bad block contents";
    local_38.size_ = 0x12;
    local_48.data_ = "";
    local_48.size_ = 0;
    Status::Status(&local_50,kCorruption,&local_38,&local_48);
    this_00 = (Iter *)NewErrorIterator(&local_50);
    if (local_50.state_ != (char *)0x0) {
      operator_delete__(local_50.state_);
    }
  }
  else {
    data = this->data_;
    num_restarts = *(uint32_t *)(data + (this->size_ - 4));
    if (num_restarts == 0) {
      pIVar1 = NewEmptyIterator();
      return pIVar1;
    }
    this_00 = (Iter *)operator_new(0x80);
    Iter::Iter(this_00,comparator,data,this->restart_offset_,num_restarts);
  }
  return &this_00->super_Iterator;
}

Assistant:

Iterator* Block::NewIterator(const Comparator* comparator) {
  if (size_ < sizeof(uint32_t)) {
    return NewErrorIterator(Status::Corruption("bad block contents"));
  }
  const uint32_t num_restarts = NumRestarts();
  if (num_restarts == 0) {
    return NewEmptyIterator();
  } else {
    return new Iter(comparator, data_, restart_offset_, num_restarts);
  }
}